

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void sysbvm_parser_parseKeywordMessageParts
               (sysbvm_context_t *context,sysbvm_parser_state_t *state,sysbvm_tuple_t *outSelector,
               sysbvm_tuple_t *outArguments)

{
  size_t startIndex;
  int iVar1;
  sysbvm_tuple_t sVar2;
  sysbvm_tuple_t orderedCollection;
  sysbvm_tuple_t sVar3;
  sysbvm_tuple_t keywordSourcePosition;
  sysbvm_tuple_t argument;
  sysbvm_tuple_t argumentOrderedCollection;
  sysbvm_tuple_t selectorBuilder;
  size_t keywordEndPosition;
  size_t keywordStartPosition;
  sysbvm_tuple_t *outArguments_local;
  sysbvm_tuple_t *outSelector_local;
  sysbvm_parser_state_t *state_local;
  sysbvm_context_t *context_local;
  
  startIndex = state->tokenPosition;
  selectorBuilder = state->tokenPosition;
  sVar2 = sysbvm_stringStream_create(context);
  orderedCollection = sysbvm_orderedCollection_create(context);
  while( true ) {
    iVar1 = sysbvm_parser_lookKindAt(state,0);
    if (iVar1 != 4) break;
    sVar3 = sysbvm_parser_lookAt(state,0);
    sVar3 = sysbvm_token_getValue(sVar3);
    sysbvm_stringStream_nextPutString(context,sVar2,sVar3);
    state->tokenPosition = state->tokenPosition + 1;
    selectorBuilder = state->tokenPosition;
    sVar3 = sysbvm_parser_parseBinaryExpression(context,state);
    sysbvm_orderedCollection_add(context,orderedCollection,sVar3);
  }
  sVar3 = sysbvm_parser_makeSourcePositionForTokenRange
                    (context,state->sourceCode,state->tokenSequence,startIndex,selectorBuilder);
  sVar2 = sysbvm_stringStream_asSymbol(context,sVar2);
  sVar2 = sysbvm_astLiteralNode_create(context,sVar3,sVar2);
  *outSelector = sVar2;
  sVar2 = sysbvm_orderedCollection_asArray(context,orderedCollection);
  *outArguments = sVar2;
  return;
}

Assistant:

static void sysbvm_parser_parseKeywordMessageParts(sysbvm_context_t *context, sysbvm_parser_state_t *state, sysbvm_tuple_t *outSelector, sysbvm_tuple_t *outArguments)
{
    size_t keywordStartPosition = state->tokenPosition;
    size_t keywordEndPosition = state->tokenPosition;
    sysbvm_tuple_t selectorBuilder = sysbvm_stringStream_create(context);
    sysbvm_tuple_t argumentOrderedCollection = sysbvm_orderedCollection_create(context);
    while(sysbvm_parser_lookKindAt(state, 0) == SYSBVM_TOKEN_KIND_KEYWORD)
    {
        sysbvm_stringStream_nextPutString(context, selectorBuilder, sysbvm_token_getValue(sysbvm_parser_lookAt(state, 0)));
        ++state->tokenPosition;
        keywordEndPosition = state->tokenPosition;

        sysbvm_tuple_t argument = sysbvm_parser_parseBinaryExpression(context, state);
        sysbvm_orderedCollection_add(context, argumentOrderedCollection, argument);
    }

    sysbvm_tuple_t keywordSourcePosition = sysbvm_parser_makeSourcePositionForTokenRange(context, state->sourceCode, state->tokenSequence, keywordStartPosition, keywordEndPosition);
    *outSelector = sysbvm_astLiteralNode_create(context, keywordSourcePosition, sysbvm_stringStream_asSymbol(context, selectorBuilder));
    *outArguments = sysbvm_orderedCollection_asArray(context, argumentOrderedCollection);
}